

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
mjs::operator<<(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,version v)

{
  version v_local;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os_local;
  
  if (v == es1) {
    os_local = std::operator<<(os,"ES1");
  }
  else if (v == es3) {
    os_local = std::operator<<(os,"ES3");
  }
  else {
    if (v != es5) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/version.cpp"
                    ,0xe,
                    "std::basic_ostream<CharT> &mjs::operator<<(std::basic_ostream<CharT> &, version) [CharT = wchar_t]"
                   );
    }
    os_local = std::operator<<(os,"ES5");
  }
  return os_local;
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, version v) {
    switch (v) {
    case version::es1:      return os << "ES1";
    case version::es3:      return os << "ES3";
    case version::es5:      return os << "ES5";
    }
    assert(false);
    return os << "version{" << (int)v << "}";
}